

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonBuilder.cpp
# Opt level: O1

int __thiscall
helics::fileops::JsonMapBuilder::generatePlaceHolder
          (JsonMapBuilder *this,string *location,int32_t code)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int index;
  int local_54;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_50;
  
  local_54 = (int)(this->missing_components)._M_t._M_impl.super__Rb_tree_header._M_node_count + 2;
  paVar1 = &local_50.first.field_2;
  pcVar2 = (location->_M_dataplus)._M_p;
  local_50.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + location->_M_string_length);
  local_50.second = code;
  std::
  _Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,int>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,int>>>>
  ::_M_emplace_unique<int&,std::pair<std::__cxx11::string,int>>
            ((_Rb_tree<int,std::pair<int_const,std::pair<std::__cxx11::string,int>>,std::_Select1st<std::pair<int_const,std::pair<std::__cxx11::string,int>>>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,int>>>>
              *)&this->missing_components,&local_54,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_50.first._M_dataplus._M_p,local_50.first.field_2._M_allocated_capacity + 1
                   );
  }
  return local_54;
}

Assistant:

int JsonMapBuilder::generatePlaceHolder(const std::string& location, int32_t code)
{
    int index = static_cast<int>(missing_components.size()) + 2;
    missing_components.emplace(index, std::make_pair(location, code));
    return index;
}